

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathReleaseTimestep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t Timestep)

{
  void *pvVar1;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ReaderRequestTrackPtr Next_1;
  ReaderRequestTrackPtr tmp_1;
  TimestepList_conflict last;
  ReaderRequestTrackPtr Next;
  ReaderRequestTrackPtr tmp;
  TimestepList_conflict List;
  Evpath_WS_Stream WS_Stream;
  void *local_48;
  long *local_40;
  void *local_30;
  long *local_28;
  
  (*(code *)*in_RDI)(*(undefined8 *)(in_RSI + 8),4,"Releasing timestep %ld\n",in_RDX);
  pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x18));
  local_40 = *(long **)(in_RSI + 0x40);
  if ((*(long *)(in_RSI + 0x40) == 0) || (**(long **)(in_RSI + 0x40) != in_RDX)) {
    for (local_28 = (long *)local_40[5]; local_28 != (long *)0x0; local_28 = (long *)local_28[5]) {
      if (*local_28 == in_RDX) {
        local_40[5] = local_28[5];
        if ((local_28[3] != 0) && (*(long *)local_28[3] != 0)) {
          free(*(void **)local_28[3]);
        }
        if (local_28[3] != 0) {
          free((void *)local_28[3]);
        }
        if (local_28[4] != 0) {
          local_48 = (void *)local_28[4];
          while (local_48 != (void *)0x0) {
            pvVar1 = *(void **)((long)local_48 + 0x10);
            if (*(long *)((long)local_48 + 8) != 0) {
              free(*(void **)((long)local_48 + 8));
            }
            free(local_48);
            local_48 = pvVar1;
          }
        }
        free(local_28);
        pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x18));
        return;
      }
      local_40 = local_28;
    }
    fprintf(_stderr,"Failed to release Timestep %zd, not found\n",in_RDX);
  }
  else {
    *(long *)(in_RSI + 0x40) = local_40[5];
    if ((local_40[3] != 0) && (*(long *)local_40[3] != 0)) {
      free(*(void **)local_40[3]);
    }
    if (local_40[3] != 0) {
      free((void *)local_40[3]);
    }
    if (local_40[4] != 0) {
      local_30 = (void *)local_40[4];
      while (local_30 != (void *)0x0) {
        pvVar1 = *(void **)((long)local_30 + 0x10);
        if (*(long *)((long)local_30 + 8) != 0) {
          free(*(void **)((long)local_30 + 8));
        }
        free(local_30);
        local_30 = pvVar1;
      }
    }
    free(local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x18));
  return;
}

Assistant:

static void EvpathReleaseTimestep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t Timestep)
{
    Evpath_WS_Stream WS_Stream = (Evpath_WS_Stream)Stream_v;
    TimestepList List;

    Svcs->verbose(WS_Stream->CP_Stream, DPPerRankVerbose, "Releasing timestep %ld\n", Timestep);
    pthread_mutex_lock(&WS_Stream->DataLock);
    List = WS_Stream->Timesteps;
    if (WS_Stream->Timesteps && (WS_Stream->Timesteps->Timestep == Timestep))
    {
        WS_Stream->Timesteps = List->Next;
        if (List->DP_TimestepInfo && List->DP_TimestepInfo->CheckString)
            free(List->DP_TimestepInfo->CheckString);
        if (List->DP_TimestepInfo)
            free(List->DP_TimestepInfo);
        if (List->ReaderRequests)
        {
            ReaderRequestTrackPtr tmp = List->ReaderRequests;
            while (tmp)
            {
                ReaderRequestTrackPtr Next = tmp->Next;
                if (tmp->RequestList)
                    free(tmp->RequestList);
                free(tmp);
                tmp = Next;
            }
        }

        free(List);
    }
    else
    {
        TimestepList last = List;
        List = List->Next;
        while (List != NULL)
        {
            if (List->Timestep == Timestep)
            {
                last->Next = List->Next;
                if (List->DP_TimestepInfo && List->DP_TimestepInfo->CheckString)
                    free(List->DP_TimestepInfo->CheckString);
                if (List->DP_TimestepInfo)
                    free(List->DP_TimestepInfo);
                if (List->ReaderRequests)
                {
                    ReaderRequestTrackPtr tmp = List->ReaderRequests;
                    while (tmp)
                    {
                        ReaderRequestTrackPtr Next = tmp->Next;
                        if (tmp->RequestList)
                            free(tmp->RequestList);
                        free(tmp);
                        tmp = Next;
                    }
                }

                free(List);
                pthread_mutex_unlock(&WS_Stream->DataLock);
                return;
            }
            last = List;
            List = List->Next;
        }
        /*
         * Shouldn't ever get here because we should never release a
         * timestep that we don't have.
         */
        fprintf(stderr, "Failed to release Timestep %zd, not found\n", Timestep);
        assert(0);
    }
    pthread_mutex_unlock(&WS_Stream->DataLock);
}